

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::Scope<hgdb::json::VarStmt>::~Scope(Scope<hgdb::json::VarStmt> *this)

{
  ~Scope(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit Scope(uint32_t line) : line_num(line) {}